

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_scolumn_dfs.c
# Opt level: O0

int ilu_scolumn_dfs(int m,int jcol,int *perm_r,int *nseg,int *lsub_col,int *segrep,int *repfnz,
                   int *marker,int *parent,int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  int_t iVar2;
  int iVar3;
  int_t local_cc;
  int maxsuper;
  int_t nzlmax;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int_t nextl;
  int_t mem_error;
  int_t ifrom;
  int_t ito;
  int_t jm1ptr;
  int_t jptr;
  int_t maxdfs;
  int_t xdfs;
  int oldrep;
  int kpar;
  int kchild;
  int chrep;
  int chmark;
  int chperm;
  int myfnz;
  int fsupc;
  int *marker2;
  int local_58;
  int kperm;
  int kmark;
  int krow;
  int krep;
  int k;
  int nsuper;
  int jsuper;
  int jcolm1;
  int jcolp1;
  int *segrep_local;
  int *lsub_col_local;
  int *nseg_local;
  int *perm_r_local;
  int local_10;
  int jcol_local;
  int m_local;
  
  supno = Glu->xsup;
  lsub = Glu->supno;
  xlsub = Glu->lsub;
  _maxsuper = Glu->xlsub;
  local_cc = Glu->nzlmax;
  _jcolm1 = segrep;
  segrep_local = lsub_col;
  lsub_col_local = nseg;
  nseg_local = perm_r;
  perm_r_local._4_4_ = jcol;
  local_10 = m;
  iVar1 = sp_ienv(7);
  jsuper = perm_r_local._4_4_ + 1;
  nsuper = perm_r_local._4_4_ + -1;
  krep = lsub[perm_r_local._4_4_];
  xsup._0_4_ = _maxsuper[perm_r_local._4_4_];
  _myfnz = marker + (local_10 << 1);
  krow = 0;
  k = krep;
  do {
    if (segrep_local[krow] == -1) {
      if (perm_r_local._4_4_ == 0) {
        *lsub = 0;
        krep = 0;
      }
      else {
        iVar3 = supno[krep];
        nextl = _maxsuper[perm_r_local._4_4_];
        if ((int_t)xsup - nextl != (nextl - _maxsuper[nsuper]) + -1) {
          k = -1;
        }
        if ((int_t)xsup == nextl) {
          k = -1;
        }
        if (iVar1 <= perm_r_local._4_4_ - iVar3) {
          k = -1;
        }
        if (k == -1) {
          if (iVar3 < nsuper) {
            mem_error = _maxsuper[iVar3 + 1];
            _maxsuper[nsuper] = mem_error;
            _maxsuper[perm_r_local._4_4_] = mem_error;
            for (; nextl < (int_t)xsup; nextl = nextl + 1) {
              xlsub[mem_error] = xlsub[nextl];
              mem_error = mem_error + 1;
            }
            xsup._0_4_ = mem_error;
          }
          krep = krep + 1;
          lsub[perm_r_local._4_4_] = krep;
        }
      }
      supno[krep + 1] = jsuper;
      lsub[jsuper] = krep;
      _maxsuper[jsuper] = (int_t)xsup;
      return 0;
    }
    kperm = segrep_local[krow];
    segrep_local[krow] = -1;
    local_58 = _myfnz[kperm];
    if (local_58 != perm_r_local._4_4_) {
      _myfnz[kperm] = perm_r_local._4_4_;
      marker2._4_4_ = nseg_local[kperm];
      if (marker2._4_4_ == -1) {
        iVar3 = (int_t)xsup + 1;
        xlsub[(int_t)xsup] = kperm;
        xsup._0_4_ = iVar3;
        if (local_cc <= iVar3) {
          iVar2 = sLUMemXpand(perm_r_local._4_4_,iVar3,LSUB,&local_cc,Glu);
          if (iVar2 != 0) {
            return iVar2;
          }
          xlsub = Glu->lsub;
          xsup._4_4_ = 0;
        }
        if (local_58 != nsuper) {
          k = -1;
        }
      }
      else {
        iVar3 = supno[lsub[marker2._4_4_] + 1];
        kmark = iVar3 + -1;
        chmark = repfnz[kmark];
        if (chmark == -1) {
          maxdfs = -1;
          parent[kmark] = -1;
          repfnz[kmark] = marker2._4_4_;
          jptr = _maxsuper[supno[lsub[kmark]]];
          jm1ptr = _maxsuper[iVar3];
          do {
            while (jptr < jm1ptr) {
              oldrep = xlsub[jptr];
              jptr = jptr + 1;
              kchild = _myfnz[oldrep];
              if (kchild != perm_r_local._4_4_) {
                _myfnz[oldrep] = perm_r_local._4_4_;
                chrep = nseg_local[oldrep];
                if (chrep == -1) {
                  iVar3 = (int_t)xsup + 1;
                  xlsub[(int_t)xsup] = oldrep;
                  xsup._0_4_ = iVar3;
                  if (local_cc <= iVar3) {
                    iVar2 = sLUMemXpand(perm_r_local._4_4_,iVar3,LSUB,&local_cc,Glu);
                    if (iVar2 != 0) {
                      return iVar2;
                    }
                    xlsub = Glu->lsub;
                    xsup._4_4_ = 0;
                  }
                  if (kchild != nsuper) {
                    k = -1;
                  }
                }
                else {
                  iVar3 = supno[lsub[chrep] + 1];
                  kpar = iVar3 + -1;
                  chmark = repfnz[kpar];
                  if (chmark == -1) {
                    xplore[kmark] = jptr;
                    maxdfs = kmark;
                    parent[kpar] = kmark;
                    repfnz[kpar] = chrep;
                    jptr = _maxsuper[supno[lsub[kpar]]];
                    jm1ptr = _maxsuper[iVar3];
                    kmark = kpar;
                  }
                  else if (chrep < chmark) {
                    repfnz[kpar] = chrep;
                  }
                }
              }
            }
            _jcolm1[*lsub_col_local] = kmark;
            *lsub_col_local = *lsub_col_local + 1;
            xdfs = parent[kmark];
            if (xdfs == -1) break;
            jptr = xplore[xdfs];
            jm1ptr = _maxsuper[xdfs + 1];
            kmark = xdfs;
          } while (xdfs != -1);
        }
        else if (marker2._4_4_ < chmark) {
          repfnz[kmark] = marker2._4_4_;
        }
      }
    }
    krow = krow + 1;
  } while( true );
}

Assistant:

int
ilu_scolumn_dfs(
	   const int  m,	 /* in - number of rows in the matrix */
	   const int  jcol,	 /* in */
	   int	      *perm_r,	 /* in */
	   int	      *nseg,	 /* modified - with new segments appended */
	   int	      *lsub_col, /* in - defines the RHS vector to start the
				    dfs */
	   int	      *segrep,	 /* modified - with new segments appended */
	   int	      *repfnz,	 /* modified */
	   int	      *marker,	 /* modified */
	   int	      *parent,	 /* working array */
	   int_t      *xplore,	 /* working array */
	   GlobalLU_t *Glu	 /* modified */
	   )
{

    int     jcolp1, jcolm1, jsuper, nsuper;
    int     k, krep, krow, kmark, kperm;
    int     *marker2;		/* Used for small panel LU */
    int     fsupc;		/* First column of a snode */
    int     myfnz;		/* First nonz column of a U-segment */
    int     chperm, chmark, chrep, kchild, kpar, oldrep;
    int_t   xdfs, maxdfs; 
    int_t   jptr, jm1ptr;
    int_t   ito, ifrom; 	/* Used to compress row subscripts */
    int_t   mem_error, nextl;
    int     *xsup, *supno;
    int_t   *lsub, *xlsub;
    int_t   nzlmax;
    int     maxsuper;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    maxsuper = sp_ienv(7);
    jcolp1  = jcol + 1;
    jcolm1  = jcol - 1;
    nsuper  = supno[jcol];
    jsuper  = nsuper;
    nextl   = xlsub[jcol];
    marker2 = &marker[2*m];


    /* For each nonzero in A[*,jcol] do dfs */
    for (k = 0; lsub_col[k] != SLU_EMPTY; k++) {

	krow = lsub_col[k];
	lsub_col[k] = SLU_EMPTY;
	kmark = marker2[krow];

	/* krow was visited before, go to the next nonzero */
	if ( kmark == jcol ) continue;

	/* For each unmarked nbr krow of jcol
	 *	krow is in L: place it in structure of L[*,jcol]
	 */
	marker2[krow] = jcol;
	kperm = perm_r[krow];

	if ( kperm == SLU_EMPTY ) {
	    lsub[nextl++] = krow;	/* krow is indexed into A */
	    if ( nextl >= nzlmax ) {
		if ((mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu)))
		    return (mem_error);
		lsub = Glu->lsub;
	    }
	    if ( kmark != jcolm1 ) jsuper = SLU_EMPTY;/* Row index subset testing */
	} else {
	    /*	krow is in U: if its supernode-rep krep
	     *	has been explored, update repfnz[*]
	     */
	    krep = xsup[supno[kperm]+1] - 1;
	    myfnz = repfnz[krep];

	    if ( myfnz != SLU_EMPTY ) {	/* Visited before */
		if ( myfnz > kperm ) repfnz[krep] = kperm;
		/* continue; */
	    }
	    else {
		/* Otherwise, perform dfs starting at krep */
		oldrep = SLU_EMPTY;
		parent[krep] = oldrep;
		repfnz[krep] = kperm;
		xdfs = xlsub[xsup[supno[krep]]];
		maxdfs = xlsub[krep + 1];

		do {
		    /*
		     * For each unmarked kchild of krep
		     */
		    while ( xdfs < maxdfs ) {

			kchild = lsub[xdfs];
			xdfs++;
			chmark = marker2[kchild];

			if ( chmark != jcol ) { /* Not reached yet */
			    marker2[kchild] = jcol;
			    chperm = perm_r[kchild];

			    /* Case kchild is in L: place it in L[*,k] */
			    if ( chperm == SLU_EMPTY ) {
				lsub[nextl++] = kchild;
				if ( nextl >= nzlmax ) {
				    if ( (mem_error = sLUMemXpand(jcol,nextl,
					    LSUB,&nzlmax,Glu)) )
					return (mem_error);
				    lsub = Glu->lsub;
				}
				if ( chmark != jcolm1 ) jsuper = SLU_EMPTY;
			    } else {
				/* Case kchild is in U:
				 *   chrep = its supernode-rep. If its rep has
				 *   been explored, update its repfnz[*]
				 */
				chrep = xsup[supno[chperm]+1] - 1;
				myfnz = repfnz[chrep];
				if ( myfnz != SLU_EMPTY ) { /* Visited before */
				    if ( myfnz > chperm )
					repfnz[chrep] = chperm;
				} else {
				    /* Continue dfs at super-rep of kchild */
				    xplore[krep] = xdfs;
				    oldrep = krep;
				    krep = chrep; /* Go deeper down G(L^t) */
				    parent[krep] = oldrep;
				    repfnz[krep] = chperm;
				    xdfs = xlsub[xsup[supno[krep]]];
				    maxdfs = xlsub[krep + 1];
				} /* else */

			   } /* else */

			} /* if */

		    } /* while */

		    /* krow has no more unexplored nbrs;
		     *	  place supernode-rep krep in postorder DFS.
		     *	  backtrack dfs to its parent
		     */
		    segrep[*nseg] = krep;
		    ++(*nseg);
		    kpar = parent[krep]; /* Pop from stack, mimic recursion */
		    if ( kpar == SLU_EMPTY ) break; /* dfs done */
		    krep = kpar;
		    xdfs = xplore[krep];
		    maxdfs = xlsub[krep + 1];

		} while ( kpar != SLU_EMPTY );	/* Until empty stack */

	    } /* else */

	} /* else */

    } /* for each nonzero ... */

    /* Check to see if j belongs in the same supernode as j-1 */
    if ( jcol == 0 ) { /* Do nothing for column 0 */
	nsuper = supno[0] = 0;
    } else {
	fsupc = xsup[nsuper];
	jptr = xlsub[jcol];	/* Not compressed yet */
	jm1ptr = xlsub[jcolm1];

	if ( (nextl-jptr != jptr-jm1ptr-1) ) jsuper = SLU_EMPTY;

	/* Always start a new supernode for a singular column */
	if ( nextl == jptr ) jsuper = SLU_EMPTY;

	/* Make sure the number of columns in a supernode doesn't
	   exceed threshold. */
	if ( jcol - fsupc >= maxsuper ) jsuper = SLU_EMPTY;

	/* If jcol starts a new supernode, reclaim storage space in
	 * lsub from the previous supernode. Note we only store
	 * the subscript set of the first columns of the supernode.
	 */
	if ( jsuper == SLU_EMPTY ) {	/* starts a new supernode */
	    if ( (fsupc < jcolm1) ) { /* >= 2 columns in nsuper */
#ifdef CHK_COMPRESS
		printf("  Compress lsub[] at super %d-%d\n", fsupc, jcolm1);
#endif
		ito = xlsub[fsupc+1];
		xlsub[jcolm1] = ito;
		xlsub[jcol] = ito;
		for (ifrom = jptr; ifrom < nextl; ++ifrom, ++ito)
		    lsub[ito] = lsub[ifrom];
		nextl = ito;
	    }
	    nsuper++;
	    supno[jcol] = nsuper;
	} /* if a new supernode */

    }	/* else: jcol > 0 */

    /* Tidy up the pointers before exit */
    xsup[nsuper+1] = jcolp1;
    supno[jcolp1]  = nsuper;
    xlsub[jcolp1]  = nextl;

    return 0;
}